

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::~CheckerVisitor(CheckerVisitor *this)

{
  pointer ppEVar1;
  pointer pSVar2;
  _Hash_node_base *p_Var3;
  pointer ppEVar4;
  
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__CheckerVisitor_001a3e00;
  for (p_Var3 = (this->functionInfoMap)._M_h._M_before_begin._M_nxt;
      p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
    if ((FunctionInfo *)p_Var3[2]._M_nxt != (FunctionInfo *)0x0) {
      FunctionInfo::~FunctionInfo((FunctionInfo *)p_Var3[2]._M_nxt);
    }
  }
  ppEVar4 = (this->externalValues).
            super__Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar1 = (this->externalValues).
            super__Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar4 != ppEVar1) {
    do {
      (**((*ppEVar4)->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj)();
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 != ppEVar1);
    ppEVar4 = (this->externalValues).
              super__Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppEVar4 != (pointer)0x0) {
    operator_delete(ppEVar4,(long)(this->externalValues).
                                  super__Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar4
                   );
  }
  std::
  _Hashtable<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->astValues)._M_h);
  std::
  _Hashtable<const_char_*,_const_char_*,_std::allocator<const_char_*>,_std::__detail::_Identity,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->persistedKeys)._M_h);
  std::
  _Hashtable<const_char_*,_const_char_*,_std::allocator<const_char_*>,_std::__detail::_Identity,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->requiredModules)._M_h);
  std::
  _Hashtable<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->functionInfoMap)._M_h);
  pSVar2 = (this->nodeStack).
           super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar2 != (pointer)0x0) {
    operator_delete(pSVar2,(long)(this->nodeStack).
                                 super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar2);
    return;
  }
  return;
}

Assistant:

CheckerVisitor::~CheckerVisitor() {
  for (auto &p : functionInfoMap) {
    if (p.second)
      p.second->~FunctionInfo();
  }
  for (auto ev : externalValues)
    ev->~ExternalValueExpr();
}